

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

void __thiscall
soul::RewritingASTVisitor::replaceStatement
          (RewritingASTVisitor *this,pool_ptr<soul::AST::Statement> *s)

{
  pool_ptr<soul::AST::Statement> local_28;
  RewritingASTVisitor local_20;
  pool_ptr<soul::AST::Statement> *s_local;
  RewritingASTVisitor *this_local;
  
  local_28 = (pool_ptr<soul::AST::Statement>)s->object;
  local_20.itemsReplaced = (size_t)s;
  s_local = (pool_ptr<soul::AST::Statement> *)this;
  visitStatement(&local_20,(pool_ptr<soul::AST::Statement> *)this);
  replace<soul::pool_ptr<soul::AST::Statement>>(this,s,(pool_ptr<soul::AST::Statement> *)&local_20);
  pool_ptr<soul::AST::Statement>::~pool_ptr((pool_ptr<soul::AST::Statement> *)&local_20);
  pool_ptr<soul::AST::Statement>::~pool_ptr(&local_28);
  return;
}

Assistant:

void replaceStatement (pool_ptr<AST::Statement>& s)           { replace (s, visitStatement (s)); }